

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O0

int Gia_ManSetFailedPoCex(Gia_Man_t *pAig,Abc_Cex_t *p)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int local_3c;
  int local_38;
  int iBit;
  int k;
  int i;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Abc_Cex_t *p_local;
  Gia_Man_t *pAig_local;
  
  iVar3 = Gia_ManPiNum(pAig);
  if (iVar3 != p->nPis) {
    __assert_fail("Gia_ManPiNum(pAig) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x8b,"int Gia_ManSetFailedPoCex(Gia_Man_t *, Abc_Cex_t *)");
  }
  Gia_ManCleanMark0(pAig);
  p->iPo = -1;
  local_3c = p->nRegs;
  iBit = 0;
  do {
    if (p->iFrame < iBit) {
      Gia_ManCleanMark0(pAig);
      return p->iPo;
    }
    local_38 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(pAig);
      bVar7 = false;
      if (local_38 < iVar3) {
        pObjRi = Gia_ManCi(pAig,local_38);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar5 = Abc_InfoHasBit((uint *)(p + 1),local_3c);
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      local_38 = local_38 + 1;
      local_3c = local_3c + 1;
    }
    local_38 = 0;
    while( true ) {
      bVar7 = false;
      if (local_38 < pAig->nObjs) {
        pObjRi = Gia_ManObj(pAig,local_38);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar3 = Gia_ObjIsAnd(pObjRi);
      if (iVar3 != 0) {
        pGVar6 = Gia_ObjFanin0(pObjRi);
        uVar2 = *(ulong *)pGVar6;
        uVar5 = Gia_ObjFaninC0(pObjRi);
        pGVar6 = Gia_ObjFanin1(pObjRi);
        uVar1 = *(ulong *)pGVar6;
        uVar4 = Gia_ObjFaninC1(pObjRi);
        *(ulong *)pObjRi =
             *(ulong *)pObjRi & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) & 1
             ) << 0x1e;
      }
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(pAig->vCos);
      bVar7 = false;
      if (local_38 < iVar3) {
        pObjRi = Gia_ManCo(pAig,local_38);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(pObjRi);
      uVar2 = *(ulong *)pGVar6;
      uVar5 = Gia_ObjFaninC0(pObjRi);
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(pAig);
      bVar7 = false;
      if (local_38 < iVar3) {
        iVar3 = Gia_ManPoNum(pAig);
        pObjRo = Gia_ManCo(pAig,iVar3 + local_38);
        bVar7 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(pAig);
          _k = Gia_ManCi(pAig,iVar3 + local_38);
          bVar7 = _k != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar7) break;
      *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff |
                     (ulong)((uint)(*(ulong *)pObjRo >> 0x1e) & 1) << 0x1e;
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar3 = Gia_ManPoNum(pAig);
      bVar7 = false;
      if (local_38 < iVar3) {
        pObjRi = Gia_ManCo(pAig,local_38);
        bVar7 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) goto LAB_00874f65;
      if ((*(ulong *)pObjRi >> 0x1e & 1) != 0) break;
      local_38 = local_38 + 1;
    }
    p->iPo = local_38;
    p->iFrame = iBit;
    p->nBits = local_3c;
LAB_00874f65:
    iBit = iBit + 1;
  } while( true );
}

Assistant:

int Gia_ManSetFailedPoCex( Gia_Man_t * pAig, Abc_Cex_t * p )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k, iBit = 0;
    assert( Gia_ManPiNum(pAig) == p->nPis );
    Gia_ManCleanMark0(pAig);
    p->iPo = -1;
//    Gia_ManForEachRo( pAig, pObj, i )
//       pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        // check the POs
        Gia_ManForEachPo( pAig, pObj, k )
	    {
            if ( !pObj->fMark0 )
                continue;
            p->iPo = k;
            p->iFrame = i;
            p->nBits = iBit;
            break;
	    }
    }
    Gia_ManCleanMark0(pAig);
    return p->iPo;
}